

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyMap.cxx
# Opt level: O0

void __thiscall
cmPropertyMap::AppendProperty(cmPropertyMap *this,string *name,char *value,bool asString)

{
  mapped_type *this_00;
  ulong uVar1;
  string *pVal;
  bool asString_local;
  char *value_local;
  string *name_local;
  cmPropertyMap *this_local;
  
  if ((value != (char *)0x0) && (*value != '\0')) {
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->Map_,name);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) && (!asString)) {
      std::__cxx11::string::operator+=((string *)this_00,';');
    }
    std::__cxx11::string::operator+=((string *)this_00,value);
  }
  return;
}

Assistant:

void cmPropertyMap::AppendProperty(const std::string& name, const char* value,
                                   bool asString)
{
  // Skip if nothing to append.
  if (!value || !*value) {
    return;
  }

  {
    std::string& pVal = Map_[name];
    if (!pVal.empty() && !asString) {
      pVal += ';';
    }
    pVal += value;
  }
}